

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsItemPrivate::sceneEffectiveBoundingRect(QGraphicsItemPrivate *this)

{
  QGraphicsItemPrivate *this_00;
  QGraphicsItem *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItemPrivate *itemd;
  QGraphicsItem *parentItem;
  QRectF br;
  QPointF offset;
  QRectF *this_01;
  QGraphicsItem *local_98;
  QGraphicsItem *topMostEffectItem;
  qreal qVar1;
  QPointF local_68 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68[0].xp = -NAN;
  local_68[0].yp = -NAN;
  this_01 = in_RDI;
  topMostEffectItem = in_RSI;
  QPointF::QPointF(local_68);
  local_98 = (QGraphicsItem *)in_RSI[0x17]._vptr_QGraphicsItem;
  do {
    this_00 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
              data(&local_98->d_ptr);
    if (this_00->transformData != (TransformData *)0x0) break;
    QPointF::operator+=(local_68,&this_00->pos);
    local_98 = this_00->parent;
  } while (local_98 != (QGraphicsItem *)0x0);
  qVar1 = -NAN;
  effectiveBoundingRect((QGraphicsItemPrivate *)0xffffffffffffffff,topMostEffectItem);
  QRectF::translate(this_01,(QPointF *)in_RDI);
  if (local_98 == (QGraphicsItem *)0x0) {
    in_RDI->xp = qVar1;
    in_RDI->yp = -NAN;
    in_RDI->w = -NAN;
    in_RDI->h = -NAN;
  }
  else {
    QGraphicsItem::sceneTransform((QGraphicsItem *)this_00);
    QTransform::mapRect((QRectF *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_01;
}

Assistant:

QRectF QGraphicsItemPrivate::sceneEffectiveBoundingRect() const
{
    // Find translate-only offset
    // COMBINE
    QPointF offset;
    const QGraphicsItem *parentItem = q_ptr;
    const QGraphicsItemPrivate *itemd;
    do {
        itemd = parentItem->d_ptr.data();
        if (itemd->transformData)
            break;
        offset += itemd->pos;
    } while ((parentItem = itemd->parent));

    QRectF br = effectiveBoundingRect();
    br.translate(offset);
    return !parentItem ? br : parentItem->sceneTransform().mapRect(br);
}